

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_probe_side_optimizer.cpp
# Opt level: O1

void __thiscall
duckdb::BuildProbeSideOptimizer::BuildProbeSideOptimizer
          (BuildProbeSideOptimizer *this,ClientContext *context,LogicalOperator *op)

{
  vector<duckdb::ColumnBinding,_true> bindings;
  void *local_28 [3];
  
  (this->super_LogicalOperatorVisitor)._vptr_LogicalOperatorVisitor =
       (_func_int **)&PTR__BuildProbeSideOptimizer_02476bf0;
  this->context = context;
  (this->preferred_on_probe_side).
  super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
  super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->preferred_on_probe_side).
  super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
  super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->preferred_on_probe_side).
  super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
  super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*op->_vptr_LogicalOperator[2])(local_28,op);
  GetRowidBindings(op,&this->preferred_on_probe_side);
  LogicalOperator::ResolveOperatorTypes(op);
  if (local_28[0] != (void *)0x0) {
    operator_delete(local_28[0]);
  }
  return;
}

Assistant:

BuildProbeSideOptimizer::BuildProbeSideOptimizer(ClientContext &context, LogicalOperator &op) : context(context) {
	vector<ColumnBinding> updating_columns, current_op_bindings;
	auto bindings = op.GetColumnBindings();
	vector<ColumnBinding> row_id_bindings;
	// If any column bindings are a row_id, there is a good chance the statement is an insert/delete/update statement.
	// As an initialization step, we travers the plan and find which bindings are row_id bindings.
	// When we eventually do our build side probe side optimizations, if we get to a join where the left and right
	// cardinalities are the same, we prefer to have the child with the rowid bindings in the probe side.
	GetRowidBindings(op, preferred_on_probe_side);
	op.ResolveOperatorTypes();
}